

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O1

unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true> __thiscall
duckdb::WriteAheadLog::Replay
          (WriteAheadLog *this,FileSystem *fs,AttachedDatabase *db,string *wal_path)

{
  bool bVar1;
  WriteAheadLog *pWVar2;
  unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true> wal_handle;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> handle;
  _func_int **local_40;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_38;
  undefined8 local_30;
  
  (*fs->_vptr_FileSystem[2])(&stack0xffffffffffffffd0,fs,wal_path,0x81,0x100,0);
  if ((FileHandle *)local_30 == (FileHandle *)0x0) {
    pWVar2 = (WriteAheadLog *)operator_new(0x70);
    WriteAheadLog(pWVar2,db,wal_path,0,NO_WAL);
    this->_vptr_WriteAheadLog = (_func_int **)pWVar2;
  }
  else {
    local_38._M_head_impl = (FileHandle *)local_30;
    local_30 = (FileHandle *)0x0;
    ReplayInternal((WriteAheadLog *)&stack0xffffffffffffffc0,db,
                   (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
                   &stack0xffffffffffffffc8);
    if ((_Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>)
        local_38._M_head_impl != (FileHandle *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    local_38._M_head_impl = (FileHandle *)0x0;
    if (local_40 == (_func_int **)0x0) {
      bVar1 = AttachedDatabase::IsReadOnly(db);
      if (!bVar1) {
        (*fs->_vptr_FileSystem[0x14])(fs,wal_path,0);
      }
      pWVar2 = (WriteAheadLog *)operator_new(0x70);
      WriteAheadLog(pWVar2,db,wal_path,0,NO_WAL);
      this->_vptr_WriteAheadLog = (_func_int **)pWVar2;
    }
    else {
      this->_vptr_WriteAheadLog = local_40;
      local_40 = (_func_int **)0x0;
    }
    if (local_40 != (_func_int **)0x0) {
      (**(code **)(*local_40 + 8))();
    }
  }
  if ((FileHandle *)local_30 != (FileHandle *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  return (unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>)
         (unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>)this;
}

Assistant:

unique_ptr<WriteAheadLog> WriteAheadLog::Replay(FileSystem &fs, AttachedDatabase &db, const string &wal_path) {
	auto handle = fs.OpenFile(wal_path, FileFlags::FILE_FLAGS_READ | FileFlags::FILE_FLAGS_NULL_IF_NOT_EXISTS);
	if (!handle) {
		// WAL does not exist - instantiate an empty WAL
		return make_uniq<WriteAheadLog>(db, wal_path);
	}
	auto wal_handle = ReplayInternal(db, std::move(handle));
	if (wal_handle) {
		return wal_handle;
	}
	// replay returning NULL indicates we can nuke the WAL entirely - but only if this is not a read-only connection
	if (!db.IsReadOnly()) {
		fs.RemoveFile(wal_path);
	}
	return make_uniq<WriteAheadLog>(db, wal_path);
}